

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O3

bool ParseUInt32(string_view str,uint32_t *out)

{
  bool bVar1;
  char *__first;
  ulong uVar2;
  ulong uVar3;
  char *__last;
  long in_FS_OFFSET;
  bool bVar4;
  bool bVar5;
  __integer_from_chars_result_type<unsigned_int> _Var6;
  uint result;
  uint32_t local_1c;
  long local_18;
  
  __first = str._M_str;
  uVar2 = str._M_len;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (uVar2 < 2) {
    if (uVar2 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = 1;
      if (*__first == '+') goto LAB_00157b48;
    }
  }
  else {
    uVar3 = uVar2;
    if (*__first == '+') {
      if (__first[1] == '-') {
        bVar1 = false;
        goto LAB_00157b8c;
      }
LAB_00157b48:
      uVar3 = uVar2 - 1;
      __first = __first + 1;
    }
  }
  __last = __first + uVar3;
  _Var6 = std::from_chars<unsigned_int>(__first,__last,&local_1c,10);
  bVar4 = _Var6.ptr == __last;
  bVar5 = _Var6.ec == 0;
  bVar1 = bVar5 && bVar4;
  if ((out != (uint32_t *)0x0) && (bVar5 && bVar4)) {
    *out = local_1c;
    bVar1 = true;
  }
LAB_00157b8c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool ParseUInt32(std::string_view str, uint32_t* out)
{
    return ParseIntegral<uint32_t>(str, out);
}